

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_parser.hpp
# Opt level: O0

uint32_t __thiscall
jsoncons::jsonpath::detail::
jsonpath_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::append_to_codepoint
          (jsonpath_evaluator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,uint32_t cp,int c,error_code *ec)

{
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined4 local_c;
  
  local_c = in_ESI * 0x10;
  if ((in_EDX < 0x30) || (0x39 < in_EDX)) {
    if ((in_EDX < 0x61) || (0x66 < in_EDX)) {
      if ((in_EDX < 0x41) || (0x46 < in_EDX)) {
        std::error_code::operator=(ec,(jsonpath_errc)((ulong)in_RDI >> 0x20));
      }
      else {
        local_c = in_EDX + -0x37 + local_c;
      }
    }
    else {
      local_c = in_EDX + -0x57 + local_c;
    }
  }
  else {
    local_c = in_EDX + -0x30 + local_c;
  }
  return local_c;
}

Assistant:

uint32_t append_to_codepoint(uint32_t cp, int c, std::error_code& ec)
        {
            cp *= 16;
            if (c >= '0'  &&  c <= '9')
            {
                cp += c - '0';
            }
            else if (c >= 'a'  &&  c <= 'f')
            {
                cp += c - 'a' + 10;
            }
            else if (c >= 'A'  &&  c <= 'F')
            {
                cp += c - 'A' + 10;
            }
            else
            {
                ec = jsonpath_errc::invalid_codepoint;
            }
            return cp;
        }